

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LongReadsMapper.cc
# Opt level: O2

vector<LongReadMapping,_std::allocator<LongReadMapping>_> * __thiscall
LongReadsMapper::remove_shadowed_matches
          (vector<LongReadMapping,_std::allocator<LongReadMapping>_> *__return_storage_ptr__,
          LongReadsMapper *this,vector<LongReadMapping,_std::allocator<LongReadMapping>_> *matches)

{
  pointer pLVar1;
  const_iterator __begin2;
  pointer pLVar2;
  const_iterator __end2;
  LongReadMapping *__args;
  vector<LongReadMapping,_std::allocator<LongReadMapping>_> *__range2;
  int mi1;
  ulong uVar3;
  
  (__return_storage_ptr__->super__Vector_base<LongReadMapping,_std::allocator<LongReadMapping>_>).
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<LongReadMapping,_std::allocator<LongReadMapping>_>).
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<LongReadMapping,_std::allocator<LongReadMapping>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar3 = 0;
  do {
    pLVar2 = (matches->super__Vector_base<LongReadMapping,_std::allocator<LongReadMapping>_>).
             _M_impl.super__Vector_impl_data._M_start;
    pLVar1 = (matches->super__Vector_base<LongReadMapping,_std::allocator<LongReadMapping>_>).
             _M_impl.super__Vector_impl_data._M_finish;
    if ((ulong)((long)pLVar1 - (long)pLVar2 >> 5) <= uVar3) {
      return __return_storage_ptr__;
    }
    __args = pLVar2 + uVar3;
    for (; pLVar2 != pLVar1; pLVar2 = pLVar2 + 1) {
      if (((pLVar2->qStart <= __args->qStart) && (__args->qEnd <= pLVar2->qEnd)) &&
         (__args->score < pLVar2->score)) goto LAB_001e7ffa;
    }
    std::vector<LongReadMapping,std::allocator<LongReadMapping>>::
    emplace_back<LongReadMapping_const&>
              ((vector<LongReadMapping,std::allocator<LongReadMapping>> *)__return_storage_ptr__,
               __args);
LAB_001e7ffa:
    uVar3 = uVar3 + 1;
  } while( true );
}

Assistant:

std::vector<LongReadMapping> LongReadsMapper::remove_shadowed_matches(const std::vector<LongReadMapping> &matches) const {
    std::vector<LongReadMapping> filtered_matches;

    for (auto mi1=0;mi1<matches.size();++mi1){
        auto &m1=matches[mi1];
        bool use=true;
        for (auto &m2: matches) {
            if (m2.qStart<=m1.qStart and m2.qEnd>=m1.qEnd and m2.score>m1.score){
                use=false;
                break;
            }
        }
        if (use) filtered_matches.emplace_back(m1);
    }

    return filtered_matches;
}